

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.h
# Opt level: O3

void __thiscall
booster::callback<void_(cppcms::http::context::completion_type)>::callback<unit_test::binder>
          (callback<void_(cppcms::http::context::completion_type)> *this,binder *func)

{
  callable_impl<void,_unit_test::binder> *this_00;
  binder local_30;
  
  this_00 = (callable_impl<void,_unit_test::binder> *)operator_new(0x28);
  local_30.self.p_ = (func->self).p_;
  if (local_30.self.p_ != (unit_test *)0x0) {
    booster::intrusive_ptr_add_ref(&(local_30.self.p_)->super_application);
  }
  local_30.m = func->m;
  local_30._16_8_ = *(undefined8 *)&func->field_0x10;
  callable_impl<void,_unit_test::binder>::callable_impl(this_00,&local_30);
  (this->call_ptr).p_ = (callable<void_(cppcms::http::context::completion_type)> *)this_00;
  booster::atomic_counter::inc();
  intrusive_ptr<unit_test>::~intrusive_ptr(&local_30.self);
  return;
}

Assistant:

callback(F func) : call_ptr(new callable_impl<Result,F>(func)) 	
		{}